

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O3

void __thiscall CodeGenerator::writeResources(CodeGenerator *this,ostream *s,Class *clazz)

{
  size_type *psVar1;
  pointer pRVar2;
  pointer pcVar3;
  char cVar4;
  ostream *poVar5;
  long *plVar6;
  pointer pRVar7;
  size_type *local_90;
  Resource i;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"    // resources",0x10);
  cVar4 = (char)s;
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  pRVar7 = (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar7 != pRVar2) {
    psVar1 = &i.initializer._M_string_length;
    do {
      local_90 = &i.type._M_string_length;
      pcVar3 = (pRVar7->type)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + (pRVar7->type)._M_string_length);
      i.type.field_2._8_8_ = &i.name._M_string_length;
      pcVar3 = (pRVar7->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&i.type.field_2 + 8),pcVar3,
                 pcVar3 + (pRVar7->name)._M_string_length);
      pcVar3 = (pRVar7->initializer)._M_dataplus._M_p;
      i.name.field_2._8_8_ = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&i.name.field_2 + 8),pcVar3,
                 pcVar3 + (pRVar7->initializer)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(s,"    ",4);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (s,(char *)local_90,(long)i.type._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," *",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)i.type.field_2._8_8_,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = nullptr;",0xb);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((size_type *)i.name.field_2._8_8_ != psVar1) {
        operator_delete((void *)i.name.field_2._8_8_);
      }
      if ((size_type *)i.type.field_2._8_8_ != &i.name._M_string_length) {
        operator_delete((void *)i.type.field_2._8_8_);
      }
      if (local_90 != &i.type._M_string_length) {
        operator_delete(local_90);
      }
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != pRVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar4);
  std::ostream::put(cVar4);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"    void initResources(rengine::ResourceManager *manager) {",0x3b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pRVar7 = (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar2 = (clazz->resources).super__Vector_base<Resource,_std::allocator<Resource>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar7 != pRVar2) {
    psVar1 = &i.initializer._M_string_length;
    do {
      local_90 = &i.type._M_string_length;
      pcVar3 = (pRVar7->type)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + (pRVar7->type)._M_string_length);
      i.type.field_2._8_8_ = &i.name._M_string_length;
      pcVar3 = (pRVar7->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&i.type.field_2 + 8),pcVar3,
                 pcVar3 + (pRVar7->name)._M_string_length);
      pcVar3 = (pRVar7->initializer)._M_dataplus._M_p;
      i.name.field_2._8_8_ = psVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&i.name.field_2 + 8),pcVar3,
                 pcVar3 + (pRVar7->initializer)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(s,"        ",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (s,(char *)i.type.field_2._8_8_,(long)i.name._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = manager->acquire<",0x14);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_90,(long)i.type._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,">(\"",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)i.name.field_2._8_8_,(long)i.initializer._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\");",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((size_type *)i.name.field_2._8_8_ != psVar1) {
        operator_delete((void *)i.name.field_2._8_8_);
      }
      if ((size_type *)i.type.field_2._8_8_ != &i.name._M_string_length) {
        operator_delete((void *)i.type.field_2._8_8_);
      }
      if (local_90 != &i.type._M_string_length) {
        operator_delete(local_90);
      }
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != pRVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"    }",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar4);
  std::ostream::put(cVar4);
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  return;
}

Assistant:

void CodeGenerator::writeResources(std::ostream &s, Class *clazz)
{
    s << "    // resources" << std::endl;
    for (auto i : clazz->resources) {
        s << "    " << i.type << " *" << i.name << " = nullptr;" << std::endl;
    }
    s << std::endl
      << "    void initResources(rengine::ResourceManager *manager) {" << std::endl;
    for (auto i : clazz->resources) {
        s << "        " << i.name << " = manager->acquire<" << i.type << ">(\"" << i.initializer << "\");" << std::endl;
    }
    s << "    }" << std::endl
      << std::endl;
}